

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall fixedPreciseMeasurement_ops_Test::TestBody(fixedPreciseMeasurement_ops_Test *this)

{
  precise_unit *desired_units;
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  unit_data uVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  uint uVar7;
  pointer *__ptr_1;
  precise_unit pVar8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__6;
  fixed_precise_measurement y;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__3;
  fixed_precise_measurement d1;
  fixed_precise_measurement d2;
  fixed_precise_measurement d4;
  undefined1 local_100 [8];
  undefined8 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  undefined1 local_e0 [8];
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  undefined1 local_a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  double dStack_98;
  AssertHelper local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [16];
  undefined8 uStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined1 local_48 [16];
  double dStack_38;
  
  local_80._0_8_ = &DAT_4046800000000000;
  local_80._8_8_ = 0x3ff0000000000000;
  uStack_70 = (double)1;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4053c00000000000;
  local_58 = (undefined1  [8])0x3ff0000000000000;
  uStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)1;
  local_48._0_8_ = 1.0;
  local_48._8_8_ = 0x3fd381d7dbf487fd;
  dStack_38 = (double)1;
  local_100 = (undefined1  [8])0x3ff0000000000000;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)1;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ff0000000000000;
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_70,(unit_data *)&local_f8);
  uVar7 = local_f8._4_4_ | uStack_70._4_4_;
  local_c0 = (undefined1  [8])&DAT_40abc60000000000;
  local_e0 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_100,"area.value()","45.0 * 79",(double *)local_c0,(double *)local_e0)
  ;
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)->
               _M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ac,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_100 = (undefined1  [8])local_c8._M_head_impl;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uVar7,uVar5);
  uVar5 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::m + 8),(unit_data *)(units::precise::m + 8));
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)(uint)uVar5;
  local_e0 = (undefined1  [8])&DAT_3ff0000000000000;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_100,(precise_unit *)local_e0);
  local_c0[0] = bVar4;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_c0,
               (AssertionResult *)"area.units() == precise::m * precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ad,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_60._M_head_impl * (double)local_80._0_8_);
  local_c0 = local_58;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uStack_50;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((double)local_58 * (double)local_80._8_8_);
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_70,(unit_data *)&local_b8);
  aStack_f0._M_allocated_capacity = CONCAT44(local_b8._4_4_ | uStack_70._4_4_,uVar5);
  local_100 = (undefined1  [8])local_c8._M_head_impl;
  local_f8 = local_68;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((double)local_80._0_8_ * local_60._M_head_impl);
  local_e0 = (undefined1  [8])local_80._8_8_;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uStack_70;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((double)local_80._8_8_ * (double)local_58);
  pbStack_b0._0_4_ =
       units::detail::unit_data::operator*((unit_data *)&uStack_50,(unit_data *)&local_d8);
  pbStack_b0._4_4_ = local_d8._4_4_ | uStack_50._4_4_;
  local_c0 = (undefined1  [8])local_c8._M_head_impl;
  local_b8 = local_68;
  bVar4 = units::precise_measurement::operator==
                    ((precise_measurement *)local_100,(precise_measurement *)local_c0);
  local_a8[0] = bVar4;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_a8,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2af,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  desired_units = (precise_unit *)(local_80 + 8);
  if (local_a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  }
  local_100 = (undefined1  [8])local_60._M_head_impl;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58;
  aStack_f0._M_allocated_capacity = (size_type)uStack_50;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_100,desired_units);
  dVar2 = uStack_70;
  local_c0 = (undefined1  [8])(dVar1 + (double)local_c8._M_head_impl);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._8_8_;
  local_e0 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_100,"sum.value()","45.0 + 79.0",(double *)local_c0,(double *)local_e0
            );
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)local_f8->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_100 = (undefined1  [8])local_c8._M_head_impl;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)dVar2;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_100,(precise_unit *)units::precise::m);
  local_c0[0] = bVar4;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_c0,
               (AssertionResult *)"sum.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b3,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,(ulong)(aStack_f0._M_allocated_capacity + 1));
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c0 = (undefined1  [8])local_60._M_head_impl;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58;
  pbStack_b0 = uStack_50;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_c0,desired_units);
  local_100 = (undefined1  [8])(dVar1 + (double)local_c8._M_head_impl);
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80._8_8_;
  aStack_f0._M_allocated_capacity = (size_type)uStack_70;
  local_a8 = (undefined1  [8])local_80._0_8_;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80._8_8_;
  dStack_98 = uStack_70;
  local_c8._M_head_impl = local_60._M_head_impl;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_a8,(precise_unit *)local_58);
  local_e0 = (undefined1  [8])(dVar1 + (double)local_c8._M_head_impl);
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58;
  pbStack_d0 = uStack_50;
  local_90.data_._0_1_ =
       (internal)
       units::fixed_precise_measurement::operator==
                 ((fixed_precise_measurement *)local_100,(fixed_precise_measurement *)local_e0);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_90.data_._0_1_) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)&local_90,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b4,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c0 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  local_100 = (undefined1  [8])local_80._0_8_;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80._8_8_;
  aStack_f0._M_allocated_capacity = (size_type)uStack_70;
  local_c8._M_head_impl = local_60._M_head_impl;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_100,(precise_unit *)local_58);
  pbVar3 = uStack_50;
  local_c0 = (undefined1  [8])((double)local_c8._M_head_impl - dVar1);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  local_e0 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_100,"diff.value()","79.0 - 45",(double *)local_c0,(double *)local_e0)
  ;
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)local_f8->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_100 = (undefined1  [8])local_c8._M_head_impl;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pbVar3;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_100,(precise_unit *)units::precise::m);
  local_c0[0] = bVar4;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_c0,
               (AssertionResult *)"diff.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b8,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((double)local_80._0_8_ / local_60._M_head_impl);
  local_100 = local_58;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uStack_50;
  pVar8 = units::precise_unit::operator/(desired_units,(precise_unit *)local_100);
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar8.multiplier_;
  local_c0 = (undefined1  [8])local_c8._M_head_impl;
  local_e0 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_100,"rat.value()","45.0 / 79.0",(double *)local_c0,(double *)local_e0
            );
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)->
               _M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,699,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_100 = (undefined1  [8])local_68;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar8._8_8_;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_100,(precise_unit *)units::precise::ratio);
  local_c0[0] = bVar4;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_c0,
               (AssertionResult *)"rat.units() == precise::ratio","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,700,(char *)local_100);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  }
  local_c0 = (undefined1  [8])0x4000000000000000;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_100,"y.value()","2.0",2.0,2.0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)->
               _M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2bf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_100 = (undefined1  [8])0x4014000000000000;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
  aStack_f0._M_allocated_capacity = 1;
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_c0,(precise_measurement *)local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_100,"y.value()","5.0",(double)local_c0,5.0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)->
               _M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  local_c0 = (undefined1  [8])&DAT_401c000000000000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_100,"y.value()","7.0",7.0,7.0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_f8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8)->
               _M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  }
  if ((SUB84(uStack_70,0) == -0x56b5b78 && NAN((double)local_80._8_8_)) ||
     (SUB84(uStack_70,0) == -0x56b5b78 || NAN((double)local_80._8_8_))) {
    bVar4 = false;
  }
  else {
    bVar4 = !NAN((double)local_80._0_8_) && !NAN((double)local_80._0_8_);
  }
  local_e0[0] = bVar4;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (bVar4 == false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_e0,(AssertionResult *)"is_valid(d1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c4,(char *)local_100);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  }
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_48,(fixed_precise_measurement *)local_80);
  bVar4 = units::fixed_precise_measurement::operator==
                    ((fixed_precise_measurement *)local_48,(fixed_precise_measurement *)local_80);
  local_e0[0] = bVar4;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_e0,(AssertionResult *)"d4 == d1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c7,(char *)local_100);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  }
  local_100 = (undefined1  [8])local_48._8_8_;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)dStack_38;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_100,(precise_unit *)units::precise::ft);
  local_e0[0] = bVar4;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_100,(internal *)local_e0,
               (AssertionResult *)"d4.units() == precise::ft","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c8,(char *)local_100);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_100 != (undefined1  [8])&aStack_f0) {
      operator_delete((void *)local_100,aStack_f0._M_allocated_capacity + 1);
    }
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, ops)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);
    fixed_precise_measurement d4(1.0, precise::ft);
    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == precise::m * precise::m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == precise::m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == precise::m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79.0);
    EXPECT_TRUE(rat.units() == precise::ratio);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * precise::m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
    EXPECT_TRUE(is_valid(d1));

    d4 = d1;
    EXPECT_TRUE(d4 == d1);
    EXPECT_TRUE(d4.units() == precise::ft);
}